

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraClau.c
# Opt level: O2

int * Fra_ClauCreateMapping(Vec_Int_t *vSatVarsFrom,Vec_Int_t *vSatVarsTo,int nVarsMax)

{
  int iVar1;
  int iVar2;
  int *piVar3;
  ulong uVar4;
  int i;
  ulong uVar5;
  
  iVar1 = vSatVarsFrom->nSize;
  if (iVar1 == vSatVarsTo->nSize) {
    piVar3 = (int *)malloc((long)nVarsMax * 4);
    uVar4 = 0;
    uVar5 = (ulong)(uint)nVarsMax;
    if (nVarsMax < 1) {
      uVar5 = uVar4;
    }
    for (; uVar5 != uVar4; uVar4 = uVar4 + 1) {
      piVar3[uVar4] = -1;
    }
    for (i = 0; i < iVar1; i = i + 1) {
      iVar1 = Vec_IntEntry(vSatVarsFrom,i);
      iVar2 = Vec_IntEntry(vSatVarsTo,i);
      piVar3[iVar1] = iVar2;
      iVar1 = vSatVarsFrom->nSize;
    }
    return piVar3;
  }
  __assert_fail("Vec_IntSize(vSatVarsFrom) == Vec_IntSize(vSatVarsTo)",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/fra/fraClau.c"
                ,0x9d,"int *Fra_ClauCreateMapping(Vec_Int_t *, Vec_Int_t *, int)");
}

Assistant:

int * Fra_ClauCreateMapping( Vec_Int_t * vSatVarsFrom, Vec_Int_t * vSatVarsTo, int nVarsMax )
{
    int * pMapping, Var, i;
    assert( Vec_IntSize(vSatVarsFrom) == Vec_IntSize(vSatVarsTo) );
    pMapping = ABC_ALLOC( int, nVarsMax );
    for ( i = 0; i < nVarsMax; i++ )
        pMapping[i] = -1;
    Vec_IntForEachEntry( vSatVarsFrom, Var, i )
        pMapping[Var] = Vec_IntEntry(vSatVarsTo,i);
    return pMapping;
}